

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O0

uchar __thiscall
gpu::LuminousFilters<unsigned_char>::contrast
          (LuminousFilters<unsigned_char> *this,uchar *pixel,float cValue)

{
  int val;
  float diff;
  float cValue_local;
  uchar *pixel_local;
  LuminousFilters<unsigned_char> *this_local;
  
  cValue_local = cValue;
  if (1.0 < cValue) {
    cValue_local = (cValue - 1.0) / 2.0 + 1.0;
  }
  val = (int)((float)*pixel * cValue_local + -cValue_local * 128.0 + 128.0);
  if (val < 0x100) {
    if (val < 0) {
      val = 0;
    }
  }
  else {
    val._0_1_ = 0xff;
  }
  return (uchar)val;
}

Assistant:

FUNCTION_PREFIX T LuminousFilters<T>::contrast(const T& pixel, float cValue)
    {
      if(cValue > 1)
      {
        float diff = cValue - 1;
        cValue = 1 + diff/2;
      }
      int val = (int)((float)pixel*cValue + (-cValue*SIGNED_CHAR_MAX + SIGNED_CHAR_MAX));   
      PIXEL_DOMAIN_CHECK(val);
      return val;
    }